

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::mouseMoveEvent(QAbstractItemView *this,QMouseEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  SelectionFlag SVar3;
  bool bVar4;
  char cVar5;
  SelectionFlag SVar6;
  QPoint QVar7;
  QPoint QVar8;
  ulong uVar9;
  QObject *pQVar10;
  long in_FS_OFFSET;
  QPointF QVar11;
  QPersistentModelIndex index;
  QModelIndex local_a8;
  int local_90;
  int local_8c;
  QPoint local_88;
  QModelIndex local_80;
  QModelIndex local_68;
  QPersistentModelIndex local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  QVar11 = QSinglePointEvent::position((QSinglePointEvent *)event);
  local_68.i = (quintptr)QVar11.yp;
  local_68._0_8_ = QVar11.xp;
  QVar7 = QPointF::toPoint((QPointF *)&local_68);
  local_40 = QVar7;
  QVar8 = QAbstractItemViewPrivate::offset(this_00);
  this_00->draggedPosition =
       (QPoint)((ulong)(uint)(QVar8.xp.m_i.m_i + QVar7.xp.m_i.m_i) |
               ((ulong)QVar7 & 0xffffffff00000000) + (long)QVar8 & 0xffffffff00000000);
  if (*(int *)(*(long *)(this + 8) + 0x3a8) - 4U < 2) goto LAB_004e326e;
  if (*(int *)(*(long *)(this + 8) + 0x3a8) == 1) {
    QAbstractItemViewPrivate::maybeStartDrag(this_00,QVar7);
    goto LAB_004e326e;
  }
  local_48.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)this + 0x1f0))(&local_68,this,&local_40);
  QPersistentModelIndex::QPersistentModelIndex(&local_48,&local_68);
  local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this_00->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&this_00->pressedIndex);
  (**(code **)(*(long *)pQVar1 + 0x148))(&local_68,pQVar1,&local_80);
  if ((*(int *)(*(long *)(this + 8) + 0x3a8) != 3) ||
     (bVar4 = QAbstractItemViewPrivate::hasEditor(this_00,&local_68), !bVar4)) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&local_48);
    cVar5 = (**(code **)(*(long *)this + 0x2e0))(this,&local_80,0,event);
    if (cVar5 == '\0') {
      QVar7 = local_40;
      if (this_00->selectionMode != SingleSelection) {
        QVar8 = QAbstractItemViewPrivate::offset(this_00);
        QVar7.xp.m_i = (this_00->pressedPosition).xp.m_i - QVar8.xp.m_i;
        QVar7.yp.m_i = (this_00->pressedPosition).yp.m_i - QVar8.yp.m_i;
      }
      QAbstractItemViewPrivate::checkMouseMove(this_00,&local_48);
      cVar5 = QPersistentModelIndex::isValid();
      if ((((cVar5 != '\0') && (this_00->dragEnabled == true)) &&
          (*(int *)(*(long *)(this + 8) + 0x3a8) != 2)) && (*(int *)(event + 0x44) != 0)) {
        QAbstractItemViewPrivate::selectedDraggableIndexes((QModelIndexList *)&local_80,this_00);
        QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                  ((QArrayDataPointer<QModelIndex> *)&local_80);
        if (local_80.m.ptr != (QAbstractItemModel *)0x0) {
          *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 1;
          QAbstractItemViewPrivate::maybeStartDrag(this_00,local_40);
          goto LAB_004e3264;
        }
      }
      if (((byte)event[0x44] & 1) != 0) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&local_48);
        cVar5 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).
                                       super_QFramePrivate.super_QWidgetPrivate + 0x138))
                          (this_00,&local_80);
        if (cVar5 != '\0') {
          bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this_00->selectionModel);
          if (bVar4) {
            *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 2;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&local_48);
            SVar6 = (**(code **)(*(long *)this + 0x2e8))(this,&local_80,event);
            SVar3 = SVar6 & ~Toggle | this_00->ctrlDragSelectionFlag;
            if ((SVar6 & Toggle) == NoUpdate) {
              SVar3 = SVar6;
            }
            if (this_00->ctrlDragSelectionFlag == NoUpdate) {
              SVar3 = SVar6;
            }
            local_90 = (int)QVar7.xp.m_i;
            local_8c = (int)QVar7.yp.m_i;
            local_88 = local_40;
            (**(code **)(*(long *)this + 0x2c8))(this,&local_90,SVar3);
            cVar5 = QPersistentModelIndex::isValid();
            if (cVar5 != '\0') {
              QItemSelectionModel::currentIndex();
              bVar4 = ::operator!=(&local_48,&local_80);
              if (bVar4) {
                QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a8,&local_48);
                uVar9 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_a8);
                if ((uVar9 & 0x20) != 0) {
                  pDVar2 = (this_00->selectionModel).wp.d;
                  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
                    pQVar10 = (QObject *)0x0;
                  }
                  else {
                    pQVar10 = (this_00->selectionModel).wp.value;
                  }
                  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&local_48);
                  (**(code **)(*(long *)pQVar10 + 0x60))(pQVar10,&local_80,0);
                  goto LAB_004e3264;
                }
              }
            }
            local_80._0_8_ = QMouseEvent::pos(event);
            bVar4 = QAbstractItemViewPrivate::shouldAutoScroll(this_00,(QPoint *)&local_80);
            if ((bVar4) && ((this_00->autoScrollTimer).m_id == Invalid)) {
              startAutoScroll(this);
            }
          }
        }
      }
    }
  }
LAB_004e3264:
  QPersistentModelIndex::~QPersistentModelIndex(&local_48);
LAB_004e326e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    QPoint bottomRight = event->position().toPoint();

    d->draggedPosition = bottomRight + d->offset();

    if (state() == ExpandingState || state() == CollapsingState)
        return;

#if QT_CONFIG(draganddrop)
    if (state() == DraggingState) {
        d->maybeStartDrag(bottomRight);
        return;
    }
#endif // QT_CONFIG(draganddrop)

    QPersistentModelIndex index = indexAt(bottomRight);
    QModelIndex buddy = d->model->buddy(d->pressedIndex);
    if ((state() == EditingState && d->hasEditor(buddy))
        || edit(index, NoEditTriggers, event))
        return;

    const QPoint topLeft =
            d->selectionMode != SingleSelection ? d->pressedPosition - d->offset() : bottomRight;

    d->checkMouseMove(index);

#if QT_CONFIG(draganddrop)
    if (d->pressedIndex.isValid()
        && d->dragEnabled
        && (state() != DragSelectingState)
        && (event->buttons() != Qt::NoButton)
        && !d->selectedDraggableIndexes().isEmpty()) {
            setState(DraggingState);
            d->maybeStartDrag(bottomRight);
            return;
    }
#endif

    if ((event->buttons() & Qt::LeftButton) && d->selectionAllowed(index) && d->selectionModel) {
        setState(DragSelectingState);
        QItemSelectionModel::SelectionFlags command = selectionCommand(index, event);
        if (d->ctrlDragSelectionFlag != QItemSelectionModel::NoUpdate && command.testFlag(QItemSelectionModel::Toggle)) {
            command &= ~QItemSelectionModel::Toggle;
            command |= d->ctrlDragSelectionFlag;
        }

        // Do the normalize ourselves, since QRect::normalized() is flawed
        QRect selectionRect = QRect(topLeft, bottomRight);
        setSelection(selectionRect, command);

        // set at the end because it might scroll the view
        if (index.isValid() && (index != d->selectionModel->currentIndex()) && d->isIndexEnabled(index))
            d->selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
        else if (d->shouldAutoScroll(event->pos()) && !d->autoScrollTimer.isActive())
            startAutoScroll();
    }
}